

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_striped_sse41_128_64.c
# Opt level: O1

parasail_result_t *
parasail_sw_table_striped_profile_sse41_128_64
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  ulong uVar1;
  long *plVar2;
  void *pvVar3;
  parasail_matrix_t *ppVar4;
  int *piVar5;
  uint uVar6;
  bool bVar7;
  __m128i *palVar8;
  int iVar9;
  parasail_result_t *result;
  __m128i *b;
  __m128i *palVar10;
  __m128i *b_00;
  __m128i *palVar11;
  size_t len;
  ulong uVar12;
  undefined8 extraout_RDX;
  ulong uVar13;
  __m128i *ptr;
  uint uVar14;
  long lVar15;
  int iVar16;
  ulong uVar17;
  long lVar18;
  uint uVar19;
  long lVar20;
  long lVar21;
  ulong uVar22;
  int iVar23;
  ulong size;
  long lVar24;
  bool bVar25;
  ulong uVar26;
  __m128i_64_t B_3;
  undefined1 auVar27 [16];
  __m128i_64_t B_1;
  undefined1 auVar28 [16];
  long lVar29;
  long lVar30;
  __m128i_64_t B;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar36;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  long lVar39;
  undefined1 auVar38 [16];
  __m128i c;
  __m128i c_00;
  int32_t column_len;
  long local_d8;
  __m128i *local_d0;
  ulong uStack_50;
  ulong uStack_40;
  longlong extraout_RDX_00;
  longlong lVar37;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_table_striped_profile_sse41_128_64_cold_8();
  }
  else {
    pvVar3 = (profile->profile64).score;
    if (pvVar3 == (void *)0x0) {
      parasail_sw_table_striped_profile_sse41_128_64_cold_7();
    }
    else {
      ppVar4 = profile->matrix;
      if (ppVar4 == (parasail_matrix_t *)0x0) {
        parasail_sw_table_striped_profile_sse41_128_64_cold_6();
      }
      else {
        uVar14 = profile->s1Len;
        if ((int)uVar14 < 1) {
          parasail_sw_table_striped_profile_sse41_128_64_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_table_striped_profile_sse41_128_64_cold_4();
        }
        else {
          uVar12 = (ulong)(uint)s2Len;
          if (s2Len < 1) {
            parasail_sw_table_striped_profile_sse41_128_64_cold_3();
          }
          else if (open < 0) {
            parasail_sw_table_striped_profile_sse41_128_64_cold_2();
          }
          else if (gap < 0) {
            parasail_sw_table_striped_profile_sse41_128_64_cold_1();
          }
          else {
            uVar1 = (ulong)uVar14 + 1;
            iVar23 = ppVar4->max;
            result = parasail_result_new_table1((uint)uVar1 & 0x7ffffffe,s2Len);
            if (result != (parasail_result_t *)0x0) {
              size = uVar1 >> 1;
              result->flag = result->flag | 0x2820804;
              b = parasail_memalign___m128i(0x10,size);
              palVar10 = parasail_memalign___m128i(0x10,size);
              local_d0 = parasail_memalign___m128i(0x10,size);
              b_00 = parasail_memalign___m128i(0x10,size);
              c[1]._1_7_ = (undefined7)((ulong)extraout_RDX >> 8);
              c[1]._0_1_ = (b_00 == (__m128i *)0x0 || local_d0 == (__m128i *)0x0) ||
                           (palVar10 == (__m128i *)0x0 || b == (__m128i *)0x0);
              if ((b_00 != (__m128i *)0x0 && local_d0 != (__m128i *)0x0) &&
                  (palVar10 != (__m128i *)0x0 && b != (__m128i *)0x0)) {
                len = 0x7fffffffffffffff;
                uVar26 = (ulong)(uint)gap;
                c[0] = size;
                parasail_memset___m128i(b,c,0x7fffffffffffffff);
                c_00[1] = extraout_RDX_00;
                c_00[0] = size;
                parasail_memset___m128i(b_00,c_00,len);
                uStack_50 = (ulong)(uint)gap;
                uStack_40 = (ulong)(uint)open;
                uVar17 = 0;
                uVar6 = (uint)size;
                lVar15 = size * uVar12 * 4;
                local_d8 = -0x4000000000000000;
                lVar20 = 0;
                uVar13 = 0;
                auVar27 = _DAT_008d0d00;
                auVar28 = _DAT_008d0d00;
                do {
                  ptr = b;
                  iVar16 = ppVar4->mapper[(byte)s2[uVar13]];
                  palVar11 = local_d0;
                  b = palVar10;
                  if ((int)uVar17 == (int)uVar13 + -2) {
                    palVar11 = palVar10;
                    b = local_d0;
                  }
                  lVar37 = ptr[uVar6 - 1][0];
                  lVar32 = 0;
                  lVar18 = 0;
                  lVar30 = 0;
                  lVar21 = 0;
                  lVar24 = lVar20;
                  do {
                    plVar2 = (long *)((long)pvVar3 + lVar18 + (long)iVar16 * (long)(int)uVar6 * 0x10
                                     );
                    lVar32 = lVar32 + *plVar2;
                    lVar36 = lVar37 + plVar2[1];
                    lVar33 = *(long *)((long)*b_00 + lVar18);
                    if (lVar33 < lVar32) {
                      lVar33 = lVar32;
                    }
                    lVar32 = *(long *)((long)*b_00 + lVar18 + 8);
                    if (lVar32 < lVar36) {
                      lVar32 = lVar36;
                    }
                    if (lVar33 <= lVar30) {
                      lVar33 = lVar30;
                    }
                    if (lVar32 <= lVar21) {
                      lVar32 = lVar21;
                    }
                    if (lVar33 < 1) {
                      lVar33 = 0;
                    }
                    if (lVar32 < 1) {
                      lVar32 = 0;
                    }
                    plVar2 = (long *)((long)*b_00 + lVar18);
                    lVar36 = *plVar2;
                    lVar39 = plVar2[1];
                    plVar2 = (long *)((long)*b + lVar18);
                    *plVar2 = lVar33;
                    plVar2[1] = lVar32;
                    piVar5 = ((result->field_4).rowcols)->score_row;
                    *(int *)((long)piVar5 + lVar24) = (int)lVar33;
                    *(int *)((long)piVar5 + lVar15 + lVar24) = (int)lVar32;
                    lVar29 = lVar33;
                    if (lVar33 <= auVar28._0_8_) {
                      lVar29 = auVar28._0_8_;
                    }
                    lVar31 = lVar32;
                    if (lVar32 <= auVar28._8_8_) {
                      lVar31 = auVar28._8_8_;
                    }
                    lVar33 = lVar33 - (ulong)(uint)open;
                    lVar32 = lVar32 - uStack_40;
                    lVar36 = lVar36 - uVar26;
                    lVar39 = lVar39 - uStack_50;
                    if (lVar36 <= lVar33) {
                      lVar36 = lVar33;
                    }
                    if (lVar39 <= lVar32) {
                      lVar39 = lVar32;
                    }
                    auVar28._8_8_ = lVar31;
                    auVar28._0_8_ = lVar29;
                    lVar29 = lVar30 - uVar26;
                    lVar31 = lVar21 - uStack_50;
                    lVar30 = lVar33;
                    if (lVar33 < lVar29) {
                      lVar30 = lVar29;
                    }
                    lVar21 = lVar32;
                    if (lVar32 < lVar31) {
                      lVar21 = lVar31;
                    }
                    plVar2 = (long *)((long)*b_00 + lVar18);
                    *plVar2 = lVar36;
                    plVar2[1] = lVar39;
                    plVar2 = (long *)((long)*ptr + lVar18);
                    lVar32 = *plVar2;
                    lVar37 = plVar2[1];
                    lVar18 = lVar18 + 0x10;
                    lVar24 = lVar24 + uVar12 * 4;
                  } while (size << 4 != lVar18);
                  iVar16 = 0;
                  do {
                    lVar18 = 0;
                    lVar32 = lVar20;
                    lVar21 = 0;
                    lVar24 = lVar30;
                    do {
                      lVar30 = *(long *)((long)*b + lVar18);
                      lVar33 = *(long *)((long)*b + lVar18 + 8);
                      lVar36 = lVar21;
                      if (lVar21 < lVar30) {
                        lVar36 = lVar30;
                      }
                      lVar39 = lVar24;
                      if (lVar24 < lVar33) {
                        lVar39 = lVar33;
                      }
                      plVar2 = (long *)((long)*b + lVar18);
                      *plVar2 = lVar36;
                      plVar2[1] = lVar39;
                      piVar5 = ((result->field_4).rowcols)->score_row;
                      *(int *)((long)piVar5 + lVar32) = (int)lVar36;
                      lVar29 = (long)piVar5 + lVar32;
                      lVar33 = lVar36;
                      if (lVar36 <= auVar28._0_8_) {
                        lVar33 = auVar28._0_8_;
                      }
                      *(int *)(lVar15 + lVar29) = (int)lVar39;
                      lVar31 = lVar39;
                      if (lVar39 <= auVar28._8_8_) {
                        lVar31 = auVar28._8_8_;
                      }
                      auVar28._8_8_ = lVar31;
                      auVar28._0_8_ = lVar33;
                      lVar30 = lVar21 - uVar26;
                      lVar24 = lVar24 - uStack_50;
                      auVar38._0_8_ = -(ulong)((long)(lVar36 - (ulong)(uint)open) < lVar30);
                      auVar38._8_8_ = -(ulong)((long)(lVar39 - uStack_40) < lVar24);
                      uVar19 = movmskpd((int)lVar29,auVar38);
                      uVar22 = -(ulong)(byte)((byte)uVar19 >> 1);
                      auVar34._8_8_ = uVar22;
                      auVar34._0_8_ = -(ulong)(uVar19 & 1);
                      if ((((((((((((((((auVar34 >> 7 & (undefined1  [16])0x1) ==
                                        (undefined1  [16])0x0 &&
                                       (auVar34 >> 0xf & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) &&
                                      (auVar34 >> 0x17 & (undefined1  [16])0x1) ==
                                      (undefined1  [16])0x0) &&
                                     (auVar34 >> 0x1f & (undefined1  [16])0x1) ==
                                     (undefined1  [16])0x0) &&
                                    (auVar34 >> 0x27 & (undefined1  [16])0x1) ==
                                    (undefined1  [16])0x0) &&
                                   (auVar34 >> 0x2f & (undefined1  [16])0x1) ==
                                   (undefined1  [16])0x0) &&
                                  (auVar34 >> 0x37 & (undefined1  [16])0x1) == (undefined1  [16])0x0
                                  ) && (auVar34 >> 0x3f & (undefined1  [16])0x1) ==
                                       (undefined1  [16])0x0) && (uVar22 >> 7 & 1) == 0) &&
                               (uVar22 >> 0xf & 1) == 0) && (uVar22 >> 0x17 & 1) == 0) &&
                             (uVar22 >> 0x1f & 1) == 0) && (uVar22 >> 0x27 & 1) == 0) &&
                           (uVar22 >> 0x2f & 1) == 0) && (uVar22 >> 0x37 & 1) == 0) &&
                          -1 < (long)uVar22) goto LAB_006a314f;
                      lVar18 = lVar18 + 0x10;
                      lVar32 = lVar32 + uVar12 * 4;
                      lVar21 = lVar30;
                    } while (size << 4 != lVar18);
                    bVar25 = iVar16 == 0;
                    iVar16 = iVar16 + 1;
                  } while (bVar25);
LAB_006a314f:
                  bVar25 = auVar27._8_8_ < lVar31;
                  uVar22 = -(ulong)bVar25;
                  auVar35._8_8_ = uVar22;
                  auVar35._0_8_ = -(ulong)(auVar27._0_8_ < lVar33);
                  bVar7 = true;
                  if ((((((((((((((((auVar35 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                   || (auVar35 >> 0xf & (undefined1  [16])0x1) !=
                                      (undefined1  [16])0x0) ||
                                  (auVar35 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0
                                  ) || (auVar35 >> 0x1f & (undefined1  [16])0x1) !=
                                       (undefined1  [16])0x0) ||
                                (auVar35 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                               || (auVar35 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar35 >> 0x37 & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) ||
                             (auVar35 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (uVar22 >> 7 & 1) != 0) || (uVar22 >> 0xf & 1) != 0) ||
                          (uVar22 >> 0x17 & 1) != 0) || (uVar22 >> 0x1f & 1) != 0) ||
                        (uVar22 >> 0x27 & 1) != 0) || (uVar22 >> 0x2f & 1) != 0) ||
                      (uVar22 >> 0x37 & 1) != 0) || bVar25) {
                    local_d8 = lVar31;
                    if (lVar31 < lVar33) {
                      local_d8 = lVar33;
                    }
                    if ((long)(~(long)iVar23 + 0x7fffffffffffffffU) < local_d8) {
                      *(byte *)&result->flag = (byte)result->flag | 0x40;
                      bVar7 = false;
                    }
                    else {
                      auVar27._8_4_ = (int)local_d8;
                      auVar27._0_8_ = local_d8;
                      auVar27._12_4_ = (int)((ulong)local_d8 >> 0x20);
                      uVar17 = uVar13 & 0xffffffff;
                    }
                  }
                  iVar16 = (int)uVar13;
                  if (!bVar7) break;
                  uVar13 = uVar13 + 1;
                  lVar20 = lVar20 + 4;
                  palVar10 = ptr;
                  iVar16 = s2Len;
                  local_d0 = palVar11;
                } while (uVar13 != uVar12);
                iVar23 = (int)uVar17;
                if (local_d8 == 0x7fffffffffffffff) {
                  *(byte *)&result->flag = (byte)result->flag | 0x40;
                }
                iVar9 = parasail_result_is_saturated(result);
                palVar10 = palVar11;
                if (iVar9 == 0) {
                  palVar8 = ptr;
                  if (iVar23 == iVar16 + -2) {
                    palVar10 = ptr;
                    palVar8 = palVar11;
                  }
                  if (iVar23 == iVar16 + -1) {
                    palVar10 = b;
                    b = palVar11;
                    palVar8 = ptr;
                  }
                  ptr = palVar8;
                  iVar16 = uVar14 - 1;
                  if ((uVar1 & 0x7ffffffe) != 0) {
                    uVar12 = 0;
                    do {
                      if ((*palVar10)[uVar12] == local_d8) {
                        uVar14 = 0;
                        if ((uVar12 & 1) != 0) {
                          uVar14 = uVar6;
                        }
                        iVar9 = uVar14 + ((uint)(uVar12 >> 1) & 0x7fffffff);
                        if (iVar9 < iVar16) {
                          iVar16 = iVar9;
                        }
                      }
                      uVar12 = uVar12 + 1;
                    } while ((uVar6 & 0x3fffffff) * 2 != (int)uVar12);
                  }
                  iVar9 = (int)local_d8;
                }
                else {
                  iVar23 = 0;
                  iVar9 = -1;
                  iVar16 = 0;
                }
                result->score = iVar9;
                result->end_query = iVar16;
                result->end_ref = iVar23;
                parasail_free(b_00);
                parasail_free(palVar10);
                parasail_free(ptr);
                parasail_free(b);
                return result;
              }
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvHMax = NULL;
    __m128i* restrict pvE = NULL;
    __m128i vGapO;
    __m128i vGapE;
    __m128i vZero;
    __m128i vNegInf;
    int64_t score = 0;
    __m128i vMaxH;
    __m128i vMaxHUnit;
    int64_t maxp = 0;
    /*int64_t stop = 0;*/
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile64.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 2; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    vProfile = (__m128i*)profile->profile64.score;
    vGapO = _mm_set1_epi64x_rpl(open);
    vGapE = _mm_set1_epi64x_rpl(gap);
    vZero = _mm_setzero_si128();
    vNegInf = _mm_set1_epi64x_rpl(NEG_INF);
    score = NEG_INF;
    vMaxH = vNegInf;
    vMaxHUnit = vNegInf;
    maxp = INT64_MAX - (int64_t)(matrix->max+1);
    /*stop = profile->stop == INT32_MAX ?  INT64_MAX : (int64_t)profile->stop;*/

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_64 | PARASAIL_FLAG_LANES_2;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvHMax = parasail_memalign___m128i(16, segLen);
    pvE = parasail_memalign___m128i(16, segLen);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvHMax) return NULL;
    if (!pvE) return NULL;

    /* initialize H and E */
    parasail_memset___m128i(pvHStore, vZero, segLen);
    parasail_memset___m128i(pvE, _mm_set1_epi64x_rpl(-open), segLen);

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        __m128i vF;
        __m128i vH;
        const __m128i* vP = NULL;
        __m128i* pv = NULL;

        /* Initialize F value to 0.  Any errors to vH values will be
         * corrected in the Lazy_F loop. */
        vF = vZero;

        /* load final segment of pvHStore and shift left by 8 bytes */
        vH = _mm_load_si128(&pvHStore[segLen - 1]);
        vH = _mm_slli_si128(vH, 8);

        /* Correct part of the vProfile */
        vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        if (end_ref == j-2) {
            /* Swap in the max buffer. */
            pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }
        else {
            /* Swap the 2 H buffers. */
            pv = pvHLoad;
            pvHLoad = pvHStore;
            pvHStore = pv;
        }

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi64(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi64_rpl(vH, vE);
            vH = _mm_max_epi64_rpl(vH, vF);
            vH = _mm_max_epi64_rpl(vH, vZero);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
            vMaxH = _mm_max_epi64_rpl(vH, vMaxH);

            /* Update vE value. */
            vH = _mm_sub_epi64(vH, vGapO);
            vE = _mm_sub_epi64(vE, vGapE);
            vE = _mm_max_epi64_rpl(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi64(vF, vGapE);
            vF = _mm_max_epi64_rpl(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            vF = _mm_slli_si128(vF, 8);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi64_rpl(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vMaxH = _mm_max_epi64_rpl(vH, vMaxH);
                vH = _mm_sub_epi64(vH, vGapO);
                vF = _mm_sub_epi64(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi64_rpl(vF, vH))) goto end;
                /*vF = _mm_max_epi64_rpl(vF, vH);*/
            }
        }
end:
        {
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 8);
            }
            result->rowcols->score_row[j] = (int64_t) _mm_extract_epi64_rpl (vH, 1);
        }
#endif

        {
            __m128i vCompare = _mm_cmpgt_epi64_rpl(vMaxH, vMaxHUnit);
            if (_mm_movemask_epi8(vCompare)) {
                score = _mm_hmax_epi64_rpl(vMaxH);
                /* if score has potential to overflow, abort early */
                if (score > maxp) {
                    result->flag |= PARASAIL_FLAG_SATURATED;
                    break;
                }
                vMaxHUnit = _mm_set1_epi64x_rpl(score);
                end_ref = j;
            }
        }

        /*if (score == stop) break;*/
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore+i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    if (score == INT64_MAX) {
        result->flag |= PARASAIL_FLAG_SATURATED;
    }

    if (parasail_result_is_saturated(result)) {
        score = INT64_MAX;
        end_query = 0;
        end_ref = 0;
    }
    else {
        if (end_ref == j-1) {
            /* end_ref was the last store column */
            __m128i *pv = pvHMax;
            pvHMax = pvHStore;
            pvHStore = pv;
        }
        else if (end_ref == j-2) {
            /* end_ref was the last load column */
            __m128i *pv = pvHMax;
            pvHMax = pvHLoad;
            pvHLoad = pv;
        }
        /* Trace the alignment ending position on read. */
        {
            int64_t *t = (int64_t*)pvHMax;
            int32_t column_len = segLen * segWidth;
            end_query = s1Len - 1;
            for (i = 0; i<column_len; ++i, ++t) {
                if (*t == score) {
                    int32_t temp = i / segWidth + i % segWidth * segLen;
                    if (temp < end_query) {
                        end_query = temp;
                    }
                }
            }
        }
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(pvE);
    parasail_free(pvHMax);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}